

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  uint uVar1;
  alpnid aVar2;
  char *pcVar3;
  connectdata *pcVar4;
  connectdata *data_00;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  char *hostd;
  http_negotiation *neg;
  altsvc *paStack_50;
  int allowed_alpns;
  altsvc *as;
  alpnid local_40;
  uint uStack_3c;
  _Bool hit;
  alpnid srcalpnid;
  int port;
  char *host;
  curl_slist *pcStack_28;
  CURLcode result;
  curl_slist *conn_to_host_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  host._4_4_ = CURLE_OK;
  _srcalpnid = (char *)0x0;
  uStack_3c = 0xffffffff;
  pcStack_28 = conn_to_host;
  conn_to_host_local = (curl_slist *)conn;
  conn_local = (connectdata *)data;
  while( true ) {
    pcVar4 = conn_local;
    bVar8 = false;
    if ((pcStack_28 != (curl_slist *)0x0) && (bVar8 = false, _srcalpnid == (char *)0x0)) {
      bVar8 = uStack_3c == 0xffffffff;
    }
    if (!bVar8) break;
    host._4_4_ = parse_connect_to_string
                           ((Curl_easy *)conn_local,(connectdata *)conn_to_host_local,
                            pcStack_28->data,(char **)&srcalpnid,(int *)&stack0xffffffffffffffc4);
    if (host._4_4_ != CURLE_OK) {
      return host._4_4_;
    }
    if ((_srcalpnid == (char *)0x0) || (*_srcalpnid == '\0')) {
      conn_to_host_local[0x3e].data =
           (char *)((ulong)conn_to_host_local[0x3e].data & 0xfffffffffffffeff);
      (*Curl_cfree)(_srcalpnid);
      _srcalpnid = (char *)0x0;
    }
    else {
      conn_to_host_local[0xd].data = _srcalpnid;
      conn_to_host_local[0xe].data = _srcalpnid;
      conn_to_host_local[0x3e].data =
           (char *)((ulong)conn_to_host_local[0x3e].data & 0xfffffffffffffeff | 0x100);
      if (((conn_local != (connectdata *)0x0) &&
          ((*(ulong *)&conn_local[1].proxyntlm.target_info_len >> 0x1e & 1) != 0)) &&
         ((*(long *)(conn_local[3].secondary.remote_ip + 0xc) == 0 ||
          (0 < *(int *)(*(long *)(conn_local[3].secondary.remote_ip + 0xc) + 8))))) {
        Curl_infof((Curl_easy *)conn_local,"Connecting to hostname: %s",_srcalpnid);
      }
    }
    if ((int)uStack_3c < 0) {
      conn_to_host_local[0x3e].data =
           (char *)((ulong)conn_to_host_local[0x3e].data & 0xfffffffffffffdff);
      uStack_3c = 0xffffffff;
    }
    else {
      *(uint *)((long)&conn_to_host_local[0x5a].next + 4) = uStack_3c;
      conn_to_host_local[0x3e].data =
           (char *)((ulong)conn_to_host_local[0x3e].data & 0xfffffffffffffdff | 0x200);
      if (((conn_local != (connectdata *)0x0) &&
          ((*(ulong *)&conn_local[1].proxyntlm.target_info_len >> 0x1e & 1) != 0)) &&
         ((*(long *)(conn_local[3].secondary.remote_ip + 0xc) == 0 ||
          (0 < *(int *)(*(long *)(conn_local[3].secondary.remote_ip + 0xc) + 8))))) {
        Curl_infof((Curl_easy *)conn_local,"Connecting to port: %d",(ulong)uStack_3c);
      }
    }
    pcStack_28 = pcStack_28->next;
  }
  if ((((conn_local[1].proto.ftpc.pp.sendleft != 0) && (_srcalpnid == (char *)0x0)) &&
      (uStack_3c == 0xffffffff)) &&
     (*(int *)((long)&conn_to_host_local[0x3e].next[9].data + 4) == 2)) {
    local_40 = ALPN_none;
    as._7_1_ = false;
    paStack_50 = (altsvc *)0x0;
    neg._4_4_ = 0;
    if (((ulong)conn_local[3].recv[0] & 0x10000) != 0) {
      neg._4_4_ = 8;
    }
    _srcalpnid = conn_to_host_local[10].data;
    if ((((ulong)conn_local[3].recv[0] & 0x100) != 0) &&
       ((*(byte *)((long)conn_local[3].recv + 3) >> 3 & 1) == 0)) {
      local_40 = ALPN_h1;
      as._7_1_ = Curl_altsvc_lookup((altsvcinfo *)conn_local[1].proto.rtspc.buf.allc,ALPN_h1,
                                    _srcalpnid,*(int *)&conn_to_host_local[0x5a].next,
                                    &stack0xffffffffffffffb0,
                                    (uint)*(undefined8 *)
                                           (conn_local[1].proto.ftpc.pp.sendleft + 0x28) & neg._4_4_
                                   );
    }
    if ((_Bool)as._7_1_ != false) {
      pcVar5 = (*Curl_cstrdup)((paStack_50->dst).host);
      data_00 = conn_local;
      if (pcVar5 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      conn_to_host_local[0xd].data = pcVar5;
      conn_to_host_local[0xe].data = pcVar5;
      conn_to_host_local[0x3e].data =
           (char *)((ulong)conn_to_host_local[0x3e].data & 0xfffffffffffffeff | 0x100);
      *(uint *)((long)&conn_to_host_local[0x5a].next + 4) = (uint)(paStack_50->dst).port;
      conn_to_host_local[0x3e].data =
           (char *)((ulong)conn_to_host_local[0x3e].data & 0xfffffffffffffdff | 0x200);
      conn_to_host_local[0x3e].data =
           (char *)((ulong)conn_to_host_local[0x3e].data & 0xffffffffffffff7f | 0x80);
      if (((conn_local != (connectdata *)0x0) &&
          ((*(ulong *)&conn_local[1].proxyntlm.target_info_len >> 0x1e & 1) != 0)) &&
         ((*(long *)(conn_local[3].secondary.remote_ip + 0xc) == 0 ||
          (0 < *(int *)(*(long *)(conn_local[3].secondary.remote_ip + 0xc) + 8))))) {
        pcVar6 = Curl_alpnid2str(local_40);
        pcVar3 = _srcalpnid;
        uVar1 = *(uint *)&conn_to_host_local[0x5a].next;
        pcVar7 = Curl_alpnid2str((paStack_50->dst).alpnid);
        Curl_infof((Curl_easy *)data_00,"Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",pcVar6,
                   pcVar3,(ulong)uVar1,pcVar7,pcVar5,(uint)(paStack_50->dst).port);
      }
      if (local_40 != (paStack_50->dst).alpnid) {
        aVar2 = (paStack_50->dst).alpnid;
        if (aVar2 == ALPN_h1) {
          *(undefined1 *)((long)pcVar4[3].recv + 2) = 1;
          *(undefined1 *)((long)pcVar4[3].recv + 1) = 1;
          *(byte *)((long)pcVar4[3].recv + 3) = *(byte *)((long)pcVar4[3].recv + 3) & 0xf7;
        }
        else if (aVar2 == ALPN_h2) {
          *(undefined1 *)((long)pcVar4[3].recv + 2) = 2;
          *(undefined1 *)((long)pcVar4[3].recv + 1) = 2;
        }
        else if (aVar2 == ALPN_h3) {
          *(undefined1 *)((long)&conn_to_host_local[0x5b].next + 2) = 5;
          *(undefined1 *)((long)pcVar4[3].recv + 2) = 4;
          *(undefined1 *)((long)pcVar4[3].recv + 1) = 4;
        }
      }
    }
  }
  return host._4_4_;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi && !host && (port == -1) &&
     ((conn->handler->protocol == CURLPROTO_HTTPS) ||
#ifdef DEBUGBUILD
      /* allow debug builds to circumvent the HTTPS restriction */
      getenv("CURL_ALTSVC_HTTP")
#else
      0
#endif
       )) {
    /* no connect_to match, try alt-svc! */
    enum alpnid srcalpnid = ALPN_none;
    bool hit = FALSE;
    struct altsvc *as = NULL;
    int allowed_alpns = ALPN_none;
    struct http_negotiation *neg = &data->state.http_neg;

    DEBUGF(infof(data, "Alt-svc check wanted=%x, allowed=%x",
                 neg->wanted, neg->allowed));
#ifdef USE_HTTP3
    if(neg->allowed & CURL_HTTP_V3x)
      allowed_alpns |= ALPN_h3;
#endif
#ifdef USE_HTTP2
    if(neg->allowed & CURL_HTTP_V2x)
      allowed_alpns |= ALPN_h2;
#endif
    if(neg->allowed & CURL_HTTP_V1x)
      allowed_alpns |= ALPN_h1;
    allowed_alpns &= (int)data->asi->flags;

    host = conn->host.rawalloc;
    DEBUGF(infof(data, "check Alt-Svc for host %s", host));
#ifdef USE_HTTP3
    if(!hit && (neg->wanted & CURL_HTTP_V3x)) {
      srcalpnid = ALPN_h3;
      hit = Curl_altsvc_lookup(data->asi,
                               ALPN_h3, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_alpns);
    }
 #endif
 #ifdef USE_HTTP2
    if(!hit && (neg->wanted & CURL_HTTP_V2x) &&
       !neg->h2_prior_knowledge) {
      srcalpnid = ALPN_h2;
      hit = Curl_altsvc_lookup(data->asi,
                               ALPN_h2, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_alpns);
    }
 #endif
    if(!hit && (neg->wanted & CURL_HTTP_V1x) &&
       !neg->only_10) {
      srcalpnid = ALPN_h1;
      hit = Curl_altsvc_lookup(data->asi,
                               ALPN_h1, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_alpns);
    }

    if(hit) {
      char *hostd = strdup((char *)as->dst.host);
      if(!hostd)
        return CURLE_OUT_OF_MEMORY;
      conn->conn_to_host.rawalloc = hostd;
      conn->conn_to_host.name = hostd;
      conn->bits.conn_to_host = TRUE;
      conn->conn_to_port = as->dst.port;
      conn->bits.conn_to_port = TRUE;
      conn->bits.altused = TRUE;
      infof(data, "Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",
            Curl_alpnid2str(srcalpnid), host, conn->remote_port,
            Curl_alpnid2str(as->dst.alpnid), hostd, as->dst.port);
      if(srcalpnid != as->dst.alpnid) {
        /* protocol version switch */
        switch(as->dst.alpnid) {
        case ALPN_h1:
          neg->wanted = neg->allowed = CURL_HTTP_V1x;
          neg->only_10 = FALSE;
          break;
        case ALPN_h2:
          neg->wanted = neg->allowed = CURL_HTTP_V2x;
          break;
        case ALPN_h3:
          conn->transport = TRNSPRT_QUIC;
          neg->wanted = neg->allowed = CURL_HTTP_V3x;
          break;
        default: /* should not be possible */
          break;
        }
      }
    }
  }
#endif

  return result;
}